

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

ostream * pstack::operator<<(ostream *os,JSON<pstack::Field<char[9],_timeval>,_char> *o)

{
  ostream *poVar1;
  JSON<timeval,_char> local_40;
  timeval local_30;
  
  local_30.tv_sec = (__time_t)o->object->k;
  local_40.context = (char *)((long)&local_30.tv_usec + 7);
  local_30.tv_usec._7_1_ = 0;
  local_40.object = &local_30;
  poVar1 = operator<<(os,(JSON<const_char_*,_char> *)&local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  local_40.context = o->context;
  local_40.object = o->object->v;
  poVar1 = operator<<(poVar1,&local_40);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}